

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O2

double __thiscall
TwoStageDynamicBayesianNetwork::GetYProbabilityGeneral
          (TwoStageDynamicBayesianNetwork *this,Scope *Xscope,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *X,Scope *Ascope,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *A,Scope *YIIscope,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *YII,Scope *Yscope,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Y)

{
  uint y;
  pointer pSVar1;
  CPDDiscreteInterface *pCVar2;
  Index IVar3;
  const_reference pvVar4;
  uint uVar5;
  ulong __n;
  double dVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X_restr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> YII_restr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A_restr;
  allocator_type local_b1;
  double local_b0;
  value_type local_a4;
  Scope *local_a0;
  Scope *local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  Scope *local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  allocator_type local_48 [24];
  
  dVar6 = 1.0;
  local_b0 = 1.0;
  local_a0 = YIIscope;
  local_98 = Ascope;
  local_90 = A;
  local_88 = Xscope;
  local_80 = X;
  for (uVar5 = 0; __n = (ulong)uVar5,
      __n < (ulong)((long)(Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&Yscope->super_SDT,__n);
    y = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(Y,__n);
    pSVar1 = (this->_m_XSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_a4 = *pvVar4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
               (long)pSVar1[y].super_SDT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&pSVar1[y].super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl >>
               2,local_48);
    IndexTools::RestrictIndividualIndicesToNarrowerScope<unsigned_int>
              (local_80,local_88,
               (this->_m_XSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start + y,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
    pSVar1 = (this->_m_ASoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
               (long)pSVar1[y].super_SDT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&pSVar1[y].super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl >>
               2,(allocator_type *)&local_60);
    IndexTools::RestrictIndividualIndicesToNarrowerScope<unsigned_int>
              (local_90,local_98,
               (this->_m_ASoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start + y,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    pSVar1 = (this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
               (long)pSVar1[y].super_SDT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&pSVar1[y].super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl >>
               2,&local_b1);
    IndexTools::RestrictIndividualIndicesToNarrowerScope<unsigned_int>
              (YII,local_a0,
               (this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start + y,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
    IVar3 = IndividualToJointYiiIndices
                      (this,y,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
    pCVar2 = (this->_m_Y_CPDs).
             super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_start[y];
    (*pCVar2->_vptr_CPDDiscreteInterface[2])(pCVar2,(ulong)local_a4,(ulong)IVar3);
    local_b0 = local_b0 * dVar6;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
  }
  return local_b0;
}

Assistant:

double TwoStageDynamicBayesianNetwork::
GetYProbabilityGeneral( 
                    const Scope& Xscope,
                    const vector<Index>& X,
                    const Scope& Ascope,
                    const vector<Index>& A,
                    const Scope& YIIscope,
                    const vector<Index>& YII,
                    const Scope& Yscope,
                    const vector<Index>& Y
                    ) const
{

    double p = 1.0;
    for(Index Y_index=0; Y_index < Y.size(); Y_index++)
    {
        //Y_index is index in vector Y
        Index y = Yscope.at(Y_index); // the index to the variable we look at
        Index yVal = Y.at(Y_index); // the value of that variable 

        vector<Index> X_restr(GetXSoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToNarrowerScope(X, Xscope, GetXSoI_Y(y), X_restr );
        vector<Index> A_restr(GetASoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToNarrowerScope(A, Ascope, GetASoI_Y(y), A_restr );
        vector<Index> YII_restr(GetYSoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToNarrowerScope(YII, YIIscope, GetYSoI_Y(y), YII_restr );
        Index iiI = IndividualToJointYiiIndices(y, X_restr, A_restr, YII_restr);
        double p_y = _m_Y_CPDs[y]->Get(yVal, iiI);
        p *= p_y;
    }
    return(p);
}